

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

void __thiscall QInputDialogPrivate::textChanged(QInputDialogPrivate *this,QString *text)

{
  QObject *pQVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  void *local_38;
  QString *pQStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  lVar2 = (this->textValue).d.size;
  lVar3 = (text->d).size;
  if (lVar2 == lVar3) {
    QVar5.m_data = (this->textValue).d.ptr;
    QVar5.m_size = lVar2;
    QVar6.m_data = (text->d).ptr;
    QVar6.m_size = lVar3;
    cVar4 = QtPrivate::equalStrings(QVar5,QVar6);
    if (cVar4 != '\0') goto LAB_005072ae;
  }
  QString::operator=(&this->textValue,(QString *)text);
  local_38 = (void *)0x0;
  pQStack_30 = text;
  QMetaObject::activate(pQVar1,&QInputDialog::staticMetaObject,0,&local_38);
LAB_005072ae:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::textChanged(const QString &text)
{
    Q_Q(QInputDialog);
    if (textValue != text) {
        textValue = text;
        emit q->textValueChanged(text);
    }
}